

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::AddSourceGroup
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *name,char *regex)

{
  pointer pbVar1;
  char *name_00;
  bool bVar2;
  cmSourceGroup *this_00;
  char *parentName;
  long lVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  currentName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308;
  cmSourceGroup local_2f0;
  cmSourceGroup local_190;
  
  local_308.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = (int)((ulong)((long)(name->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(name->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
  if ((int)uVar7 < 0) {
    this_00 = (cmSourceGroup *)0x0;
    uVar4 = uVar7;
  }
  else {
    lVar3 = (ulong)uVar7 * 0x20 + 0x20;
    lVar5 = (ulong)uVar7 + 1;
    do {
      pbVar1 = (name->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_308,
                 pbVar1,(long)&(pbVar1->_M_dataplus)._M_p + lVar3);
      this_00 = GetSourceGroup(this,&local_308);
      if (this_00 != (cmSourceGroup *)0x0) {
        uVar4 = (int)lVar5 - 1;
        goto LAB_00329e06;
      }
      lVar3 = lVar3 + -0x20;
      lVar6 = lVar5 + -1;
      bVar2 = 0 < lVar5;
      lVar5 = lVar6;
    } while (lVar6 != 0 && bVar2);
    uVar4 = 0xffffffff;
    this_00 = (cmSourceGroup *)0x0;
  }
LAB_00329e06:
  if (uVar4 == uVar7) {
    if (this_00 != (cmSourceGroup *)0x0 && regex != (char *)0x0) {
      cmSourceGroup::SetGroupRegex(this_00,regex);
    }
  }
  else {
    if (uVar4 == 0xffffffff) {
      cmSourceGroup::cmSourceGroup
                (&local_2f0,
                 (((name->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,regex,(char *)0x0)
      ;
      std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::emplace_back<cmSourceGroup>
                (&this->SourceGroups,&local_2f0);
      cmSourceGroup::~cmSourceGroup(&local_2f0);
      this_00 = GetSourceGroup(this,&local_308);
      uVar4 = 0;
    }
    if (this_00 == (cmSourceGroup *)0x0) {
      cmSystemTools::Error("Could not create source group ",(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      if ((int)uVar7 < (int)uVar4) {
        uVar7 = uVar4;
      }
      lVar3 = ~(long)(int)uVar7 + (long)(int)uVar4;
      lVar5 = (long)(int)uVar4 * 0x20;
      while( true ) {
        lVar3 = lVar3 + 1;
        if (lVar3 == 0) break;
        name_00 = *(char **)((long)&(name->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p +
                            lVar5);
        parentName = cmSourceGroup::GetFullName(this_00);
        cmSourceGroup::cmSourceGroup(&local_190,name_00,(char *)0x0,parentName);
        cmSourceGroup::AddChild(this_00,&local_190);
        cmSourceGroup::~cmSourceGroup(&local_190);
        this_00 = cmSourceGroup::LookupChild
                            (this_00,*(char **)((long)&(name->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[1].
                                                  _M_dataplus._M_p + lVar5));
        lVar5 = lVar5 + 0x20;
      }
      cmSourceGroup::SetGroupRegex(this_00,regex);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_308);
  return;
}

Assistant:

void cmMakefile::AddSourceGroup(const std::vector<std::string>& name,
                                const char* regex)
{
  cmSourceGroup* sg = 0;
  std::vector<std::string> currentName;
  int i = 0;
  const int lastElement = static_cast<int>(name.size()-1);
  for(i=lastElement; i>=0; --i)
    {
    currentName.assign(name.begin(), name.begin()+i+1);
    sg = this->GetSourceGroup(currentName);
    if(sg != 0)
      {
      break;
      }
    }

  // i now contains the index of the last found component
  if(i==lastElement)
    {
    // group already exists, replace its regular expression
    if ( regex && sg)
      {
      // We only want to set the regular expression.  If there are already
      // source files in the group, we don't want to remove them.
      sg->SetGroupRegex(regex);
      }
    return;
    }
  else if(i==-1)
    {
    // group does not exist nor belong to any existing group
    // add its first component
    this->SourceGroups.push_back(cmSourceGroup(name[0].c_str(), regex));
    sg = this->GetSourceGroup(currentName);
    i = 0; // last component found
    }
  if(!sg)
    {
    cmSystemTools::Error("Could not create source group ");
    return;
    }
  // build the whole source group path
  for(++i; i<=lastElement; ++i)
    {
    sg->AddChild(cmSourceGroup(name[i].c_str(), 0, sg->GetFullName()));
    sg = sg->LookupChild(name[i].c_str());
    }

  sg->SetGroupRegex(regex);
}